

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

uint64_t io_readx(CPUArchState_conflict30 *env,CPUIOTLBEntry *iotlbentry,int mmu_idx,
                 target_ulong_conflict addr,uintptr_t retaddr,MMUAccessType access_type,MemOp op)

{
  uc_struct_conflict15 *uc;
  MemoryRegion *mr;
  hwaddr hVar1;
  MemoryRegionSection *pMVar2;
  undefined4 in_register_0000000c;
  CPUTriCoreState *__mptr;
  uint64_t val;
  uint64_t local_38;
  
  uc = (uc_struct_conflict15 *)env[-4].timer;
  pMVar2 = iotlb_to_section_tricore
                     ((CPUState *)&env[-0x32].cpu_model,iotlbentry->addr,iotlbentry->attrs);
  mr = pMVar2->mr;
  hVar1 = iotlbentry->addr;
  env[-4].irq[2] = (void *)CONCAT44(in_register_0000000c,addr);
  if (*(int *)((long)env[-4].irq + 0x34) != 0) {
    memory_region_dispatch_read_tricore
              (uc,(MemoryRegion_conflict *)mr,
               (ulong)(uint)mmu_idx + (ulong)((uint)hVar1 & 0xffffc000),&local_38,(MemOp)retaddr,
               iotlbentry->attrs);
    return local_38;
  }
  cpu_io_recompile_tricore
            ((CPUState *)&env[-0x32].cpu_model,(uintptr_t)CONCAT44(in_register_0000000c,addr));
}

Assistant:

static uint64_t io_readx(CPUArchState *env, CPUIOTLBEntry *iotlbentry,
                         int mmu_idx, target_ulong addr, uintptr_t retaddr,
                         MMUAccessType access_type, MemOp op)
{
    CPUState *cpu = env_cpu(env);
    struct uc_struct *uc = cpu->uc;
    hwaddr mr_offset;
    MemoryRegionSection *section;
    MemoryRegion *mr;
    uint64_t val;
    MemTxResult r;

    section = iotlb_to_section(cpu, iotlbentry->addr, iotlbentry->attrs);
    mr = section->mr;
    mr_offset = (iotlbentry->addr & TARGET_PAGE_MASK) + addr;
    cpu->mem_io_pc = retaddr;
    if (!cpu->can_do_io) {
        cpu_io_recompile(cpu, retaddr);
    }

    r = memory_region_dispatch_read(uc, mr, mr_offset, &val, op, iotlbentry->attrs);
    if (r != MEMTX_OK) {
#if 0
        hwaddr physaddr = mr_offset +
            section->offset_within_address_space -
            section->offset_within_region;

        cpu_transaction_failed(cpu, physaddr, addr, memop_size(op), access_type,
                               mmu_idx, iotlbentry->attrs, r, retaddr);
#endif
    }

    return val;
}